

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# root.c
# Opt level: O2

gf eval(gf *f,gf a)

{
  gf gVar1;
  uint uVar2;
  
  gVar1 = f[0x40];
  for (uVar2 = 0x3f; -1 < (int)uVar2; uVar2 = uVar2 - 1) {
    gVar1 = gf_mul(gVar1,a);
    gVar1 = gf_add(gVar1,f[uVar2]);
  }
  return gVar1;
}

Assistant:

gf eval(gf *f, gf a)
{
	int i;
	gf r;
	
	r = f[ SYS_T ];

	for (i = SYS_T-1; i >= 0; i--)
	{
		r = gf_mul(r, a);
		r = gf_add(r, f[i]);
	}

	return r;
}